

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_time.c
# Opt level: O0

int pt_tcal_header_cbr(pt_time_cal *tcal,pt_packet_cbr *packet,pt_config *config)

{
  uint64_t fcr;
  uint64_t p1;
  uint64_t cbr;
  pt_config *config_local;
  pt_packet_cbr *packet_local;
  pt_time_cal *tcal_local;
  
  if (((tcal == (pt_time_cal *)0x0) || (packet == (pt_packet_cbr *)0x0)) ||
     (config == (pt_config *)0x0)) {
    tcal_local._4_4_ = -1;
  }
  else if ((ulong)config->nom_freq == 0) {
    tcal_local._4_4_ = 0;
  }
  else if ((ulong)packet->ratio == 0) {
    tcal_local._4_4_ = -5;
  }
  else {
    tcal_local._4_4_ = pt_tcal_set_fcr(tcal,((ulong)config->nom_freq << 8) / (ulong)packet->ratio);
  }
  return tcal_local._4_4_;
}

Assistant:

int pt_tcal_header_cbr(struct pt_time_cal *tcal,
		      const struct pt_packet_cbr *packet,
		      const struct pt_config *config)
{
	uint64_t cbr, p1, fcr;

	if (!tcal || !packet || !config)
		return -pte_internal;

	p1 = config->nom_freq;
	if (!p1)
		return 0;

	/* If we know the nominal frequency, we can use it for calibration. */
	cbr = packet->ratio;
	if (!cbr)
		return -pte_bad_packet;

	fcr = (p1 << pt_tcal_fcr_shr) / cbr;

	return pt_tcal_set_fcr(tcal, fcr);
}